

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopObj.c
# Opt level: O0

void Hop_ObjConnect(Hop_Man_t *p,Hop_Obj_t *pObj,Hop_Obj_t *pFan0,Hop_Obj_t *pFan1)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Hop_Obj_t *pHVar4;
  Hop_Obj_t *pFan1_local;
  Hop_Obj_t *pFan0_local;
  Hop_Obj_t *pObj_local;
  Hop_Man_t *p_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                  ,0x7f,"void Hop_ObjConnect(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Obj_t *)");
  }
  iVar1 = Hop_ObjIsNode(pObj);
  if (iVar1 == 0) {
    __assert_fail("Hop_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                  ,0x80,"void Hop_ObjConnect(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Obj_t *)");
  }
  pObj->pFanin0 = pFan0;
  pObj->pFanin1 = pFan1;
  if (p->fRefCount == 0) {
    iVar1 = Hop_ObjLevelNew(pObj);
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 & 0x3f | iVar1 << 6;
  }
  else {
    if (pFan0 != (Hop_Obj_t *)0x0) {
      pHVar4 = Hop_ObjFanin0(pObj);
      Hop_ObjRef(pHVar4);
    }
    if (pFan1 != (Hop_Obj_t *)0x0) {
      pHVar4 = Hop_ObjFanin1(pObj);
      Hop_ObjRef(pHVar4);
    }
  }
  uVar2 = Hop_ObjPhaseCompl(pFan0);
  uVar3 = Hop_ObjPhaseCompl(pFan1);
  *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 & 0xfffffff7 | (uVar2 & uVar3 & 1) << 3;
  Hop_TableInsert(p,pObj);
  return;
}

Assistant:

void Hop_ObjConnect( Hop_Man_t * p, Hop_Obj_t * pObj, Hop_Obj_t * pFan0, Hop_Obj_t * pFan1 )
{
    assert( !Hop_IsComplement(pObj) );
    assert( Hop_ObjIsNode(pObj) );
    // add the first fanin
    pObj->pFanin0 = pFan0;
    pObj->pFanin1 = pFan1;
    // increment references of the fanins and add their fanouts
    if ( p->fRefCount )
    {
        if ( pFan0 != NULL )
            Hop_ObjRef( Hop_ObjFanin0(pObj) );
        if ( pFan1 != NULL )
            Hop_ObjRef( Hop_ObjFanin1(pObj) );
    }
    else
        pObj->nRefs = Hop_ObjLevelNew( pObj );
    // set the phase
    pObj->fPhase = Hop_ObjPhaseCompl(pFan0) & Hop_ObjPhaseCompl(pFan1);
    // add the node to the structural hash table
    Hop_TableInsert( p, pObj );
}